

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  Tensor *this_00;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  byte local_41;
  uint32_t local_40;
  byte local_39;
  int rank;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  rank = (int)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (rank == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      local_39 = 1;
    }
    rank = (int)!bVar1;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (rank == 0) {
      iVar2 = Specification::NeuralNetworkLayer::outputtensor_size(local_20);
      if (0 < iVar2) {
        this_00 = Specification::NeuralNetworkLayer::outputtensor(local_20,0);
        local_40 = Specification::Tensor::rank(this_00);
        layer_00 = local_20;
        local_41 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Range",&local_69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"output",&local_91);
        checkRank(__return_storage_ptr__,layer_00,&local_68,1,1,&local_90,local_40);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          local_41 = 1;
        }
        rank = (int)!bVar1;
        if ((local_41 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (rank != 0) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        HANDLE_RESULT_AND_RETURN_ON_ERROR(checkRank(layer, "Range", 1, 1, "output", rank));
    }

    return Result();
}